

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlEnumerationPtr xmlParseEnumerationType(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlEnumerationPtr pxVar5;
  xmlEnumerationPtr pxVar6;
  xmlEnumerationPtr cur;
  xmlParserErrors error;
  xmlEnumerationPtr pxVar7;
  
  pxVar2 = ctxt->input;
  pxVar4 = pxVar2->cur;
  if (*pxVar4 == '(') {
    if (((ctxt->progressive == 0) && (500 < (long)pxVar4 - (long)pxVar2->base)) &&
       ((long)pxVar2->end - (long)pxVar4 < 500)) {
      xmlSHRINK(ctxt);
    }
    cur = (xmlEnumerationPtr)0x0;
    pxVar7 = (xmlEnumerationPtr)0x0;
    do {
      xmlNextChar(ctxt);
      xmlSkipBlankChars(ctxt);
      pxVar4 = xmlParseNmtoken(ctxt);
      pxVar5 = cur;
      if (pxVar4 == (xmlChar *)0x0) {
        error = XML_ERR_NMTOKEN_REQUIRED;
        goto LAB_0015cd7f;
      }
      for (; pxVar6 = cur, pxVar5 != (xmlEnumerationPtr)0x0; pxVar5 = pxVar5->next) {
        iVar3 = xmlStrEqual(pxVar4,pxVar5->name);
        if (iVar3 != 0) {
          xmlValidityError(ctxt,XML_DTD_DUP_TOKEN,
                           "standalone: attribute enumeration value token %s duplicated\n",pxVar4,
                           (xmlChar *)0x0);
          iVar3 = xmlDictOwns(ctxt->dict,pxVar4);
          pxVar5 = pxVar7;
          if (iVar3 == 0) {
            (*xmlFree)(pxVar4);
          }
          goto LAB_0015cd39;
        }
      }
      pxVar5 = xmlCreateEnumeration(pxVar4);
      iVar3 = xmlDictOwns(ctxt->dict,pxVar4);
      if (iVar3 == 0) {
        (*xmlFree)(pxVar4);
      }
      if (pxVar5 == (xmlEnumerationPtr)0x0) {
        xmlFreeEnumeration(cur);
        return (xmlEnumerationPtr)0x0;
      }
      pxVar6 = pxVar5;
      if (pxVar7 != (xmlEnumerationPtr)0x0) {
        pxVar7->next = pxVar5;
        pxVar6 = cur;
      }
LAB_0015cd39:
      xmlSkipBlankChars(ctxt);
      xVar1 = *ctxt->input->cur;
      cur = pxVar6;
      pxVar7 = pxVar5;
    } while (xVar1 == '|');
    if (xVar1 == ')') {
      xmlNextChar(ctxt);
      return pxVar6;
    }
    error = XML_ERR_ATTLIST_NOT_FINISHED;
  }
  else {
    cur = (xmlEnumerationPtr)0x0;
    error = XML_ERR_ATTLIST_NOT_STARTED;
  }
LAB_0015cd7f:
  xmlFatalErr(ctxt,error,(char *)0x0);
  return cur;
}

Assistant:

xmlEnumerationPtr
xmlParseEnumerationType(xmlParserCtxtPtr ctxt) {
    xmlChar *name;
    xmlEnumerationPtr ret = NULL, last = NULL, cur, tmp;

    if (RAW != '(') {
	xmlFatalErr(ctxt, XML_ERR_ATTLIST_NOT_STARTED, NULL);
	return(NULL);
    }
    SHRINK;
    do {
        NEXT;
	SKIP_BLANKS;
        name = xmlParseNmtoken(ctxt);
	if (name == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_NMTOKEN_REQUIRED, NULL);
	    return(ret);
	}
	tmp = ret;
	while (tmp != NULL) {
	    if (xmlStrEqual(name, tmp->name)) {
		xmlValidityError(ctxt, XML_DTD_DUP_TOKEN,
	  "standalone: attribute enumeration value token %s duplicated\n",
				 name, NULL);
		if (!xmlDictOwns(ctxt->dict, name))
		    xmlFree(name);
		break;
	    }
	    tmp = tmp->next;
	}
	if (tmp == NULL) {
	    cur = xmlCreateEnumeration(name);
	    if (!xmlDictOwns(ctxt->dict, name))
		xmlFree(name);
	    if (cur == NULL) {
                xmlFreeEnumeration(ret);
                return(NULL);
            }
	    if (last == NULL) ret = last = cur;
	    else {
		last->next = cur;
		last = cur;
	    }
	}
	SKIP_BLANKS;
    } while (RAW == '|');
    if (RAW != ')') {
	xmlFatalErr(ctxt, XML_ERR_ATTLIST_NOT_FINISHED, NULL);
	return(ret);
    }
    NEXT;
    return(ret);
}